

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS
ref_update_agent_tet_seed
          (REF_INTERP ref_interp,REF_INT id,REF_INT node0,REF_INT node1,REF_INT node2)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_AGENTS pRVar1;
  REF_AGENT_STRUCT *pRVar2;
  uint uVar3;
  int iVar4;
  REF_INT *pRVar5;
  long lVar6;
  long lVar7;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT face_nodes [4];
  REF_INT tri;
  int local_50;
  int local_4c;
  REF_INT local_48 [5];
  REF_INT local_34;
  
  ref_node = ref_interp->from_grid->node;
  ref_cell = ref_interp->from_tri;
  pRVar1 = ref_interp->ref_agents;
  local_48[0] = node0;
  local_48[1] = node1;
  local_48[2] = node2;
  local_48[3] = node0;
  uVar3 = ref_cell_with_face(ref_interp->from_tet,local_48,&local_4c,&local_50);
  if (uVar3 == 0) {
    if (local_4c == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x209,"ref_update_agent_tet_seed","bary update missing first");
      uVar3 = 1;
    }
    else {
      if (local_50 == -1) {
        pRVar5 = ref_node->part;
        iVar4 = ref_node->ref_mpi->id;
        if (((iVar4 == pRVar5[node0]) || (iVar4 == pRVar5[node1])) || (iVar4 == pRVar5[node2])) {
          uVar3 = ref_cell_with(ref_cell,local_48,&local_34);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x217,"ref_update_agent_tet_seed",(ulong)uVar3,"boundary tri expected");
            return uVar3;
          }
          pRVar1->agent[id].mode = REF_AGENT_AT_BOUNDARY;
        }
        else {
          iVar4 = rand();
          iVar4 = local_48[iVar4 % 3];
          lVar6 = (long)iVar4;
          pRVar2 = pRVar1->agent;
          pRVar2[id].part = ref_node->part[lVar6];
          pRVar2[id].seed = -1;
          lVar7 = -1;
          if ((-1 < lVar6) && (iVar4 < ref_node->max)) {
            lVar7 = -1;
            if (-1 < ref_node->global[lVar6]) {
              lVar7 = ref_node->global[lVar6];
            }
          }
          pRVar2[id].global = lVar7;
          pRVar2[id].mode = REF_AGENT_HOP_PART;
        }
      }
      else {
        pRVar5 = &pRVar1->agent[id].seed;
        if (*pRVar5 == local_4c) {
          *pRVar5 = local_50;
        }
        else {
          if (*pRVar5 != local_50) {
            return 5;
          }
          *pRVar5 = local_4c;
        }
      }
      uVar3 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x208,
           "ref_update_agent_tet_seed",(ulong)uVar3,"cells with walk face");
    ref_node_location(ref_node,local_48[0]);
    ref_node_location(ref_node,local_48[1]);
    ref_node_location(ref_node,local_48[2]);
    ref_node_location(ref_node,local_48[3]);
  }
  return uVar3;
}

Assistant:

REF_FCN static REF_STATUS ref_update_agent_tet_seed(REF_INTERP ref_interp,
                                                    REF_INT id, REF_INT node0,
                                                    REF_INT node1,
                                                    REF_INT node2) {
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_CELL tets = ref_interp_from_tet(ref_interp);
  REF_CELL tris = ref_interp_from_tri(ref_interp);
  REF_AGENTS ref_agents = ref_interp->ref_agents;
  REF_INT face_nodes[4], cell0, cell1;
  REF_INT tri, node;

  face_nodes[0] = node0;
  face_nodes[1] = node1;
  face_nodes[2] = node2;
  face_nodes[3] = node0;

  RSB(ref_cell_with_face(tets, face_nodes, &cell0, &cell1),
      "cells with walk face", {
        ref_node_location(ref_node, face_nodes[0]);
        ref_node_location(ref_node, face_nodes[1]);
        ref_node_location(ref_node, face_nodes[2]);
        ref_node_location(ref_node, face_nodes[3]);
      });
  if (REF_EMPTY == cell0) THROW("bary update missing first");
  if (REF_EMPTY == cell1) {
    /* if it is off proc */
    if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1) &&
        !ref_node_owned(ref_node, node2)) {
      /* pick at pseudo random */
      node = face_nodes[rand() % 3];
      ref_agent_part(ref_agents, id) = ref_node_part(ref_node, node);
      ref_agent_seed(ref_agents, id) = REF_EMPTY;
      ref_agent_global(ref_agents, id) = ref_node_global(ref_node, node);
      ref_agent_mode(ref_agents, id) = REF_AGENT_HOP_PART;
      return REF_SUCCESS;
    }
    /* hit boundary, but verifying */
    RSS(ref_cell_with(tris, face_nodes, &tri), "boundary tri expected");
    ref_agent_mode(ref_agents, id) = REF_AGENT_AT_BOUNDARY;
    return REF_SUCCESS;
  }

  if (ref_agent_seed(ref_agents, id) == cell0) {
    ref_agent_seed(ref_agents, id) = cell1;
    return REF_SUCCESS;
  }
  if (ref_agent_seed(ref_agents, id) == cell1) {
    ref_agent_seed(ref_agents, id) = cell0;
    return REF_SUCCESS;
  }

  return REF_NOT_FOUND;
}